

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

bool __thiscall QPDFParser::tooManyBadTokens(QPDFParser *this)

{
  int iVar1;
  StackFrame *pSVar2;
  bool bVar3;
  unsigned_long uVar4;
  allocator<char> local_29;
  string local_28;
  
  pSVar2 = this->frame;
  if (((ulong)((long)(pSVar2->olist).
                     super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl
                     .super__Vector_impl_data._M_finish -
              (long)(pSVar2->olist).
                    super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                    super__Vector_impl_data._M_start) < 0x13881) &&
     ((pSVar2->dict)._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x1389)) {
    iVar1 = this->max_bad_count;
    this->max_bad_count = iVar1 + -1;
    if ((iVar1 < 2) || (this->good_count < 5)) {
      iVar1 = this->bad_count;
      this->bad_count = iVar1 + 1;
      if (4 < iVar1) {
LAB_001af5d8:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,"too many errors; giving up on reading object",&local_29);
        warn(this,&local_28);
        goto LAB_001af597;
      }
      if (pSVar2->state != st_array) {
        uVar4 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&this->max_bad_count);
        if (uVar4 < (ulong)((long)(this->frame->olist).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->frame->olist).
                                  super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4))
        goto LAB_001af5d8;
      }
      this->good_count = 0;
    }
    else {
      this->good_count = 0;
      this->bad_count = 1;
    }
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "encountered errors while parsing an array or dictionary with more than 5000 elements; giving up on reading object"
               ,&local_29);
    warn(this,&local_28);
LAB_001af597:
    std::__cxx11::string::~string((string *)&local_28);
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool
QPDFParser::tooManyBadTokens()
{
    if (frame->olist.size() > 5'000 || frame->dict.size() > 5'000) {
        warn(
            "encountered errors while parsing an array or dictionary with more than 5000 "
            "elements; giving up on reading object");
        return true;
    }
    if (--max_bad_count > 0 && good_count > 4) {
        good_count = 0;
        bad_count = 1;
        return false;
    }
    if (++bad_count > 5 ||
        (frame->state != st_array && QIntC::to_size(max_bad_count) < frame->olist.size())) {
        // Give up after 5 errors in close proximity or if the number of missing dictionary keys
        // exceeds the remaining number of allowable total errors.
        warn("too many errors; giving up on reading object");
        return true;
    }
    good_count = 0;
    return false;
}